

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresdata.cpp
# Opt level: O0

void res_read_63(ResourceData *pResData,UDataInfo *pInfo,void *inBytes,int32_t length,
                UErrorCode *errorCode)

{
  UBool UVar1;
  uint8_t local_34 [4];
  UErrorCode *pUStack_30;
  UVersionInfo formatVersion;
  UErrorCode *errorCode_local;
  int32_t length_local;
  void *inBytes_local;
  UDataInfo *pInfo_local;
  ResourceData *pResData_local;
  
  pUStack_30 = errorCode;
  memset(pResData,0,0x40);
  UVar1 = U_FAILURE(*pUStack_30);
  if (UVar1 == '\0') {
    UVar1 = isAcceptable(local_34,(char *)0x0,(char *)0x0,pInfo);
    if (UVar1 == '\0') {
      *pUStack_30 = U_INVALID_FORMAT_ERROR;
    }
    else {
      res_init(pResData,local_34,inBytes,length,pUStack_30);
    }
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
res_read(ResourceData *pResData,
         const UDataInfo *pInfo, const void *inBytes, int32_t length,
         UErrorCode *errorCode) {
    UVersionInfo formatVersion;

    uprv_memset(pResData, 0, sizeof(ResourceData));
    if(U_FAILURE(*errorCode)) {
        return;
    }
    if(!isAcceptable(formatVersion, NULL, NULL, pInfo)) {
        *errorCode=U_INVALID_FORMAT_ERROR;
        return;
    }
    res_init(pResData, formatVersion, inBytes, length, errorCode);
}